

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_linecurve.cpp
# Opt level: O2

bool __thiscall
ON_LineCurve::Split(ON_LineCurve *this,double t,ON_Curve **left_side,ON_Curve **right_side)

{
  ON_Interval *this_00;
  double t0;
  double t1;
  double t_00;
  bool bVar1;
  ON_LineCurve *this_01;
  ON_LineCurve *this_02;
  char *sFormat;
  int iVar2;
  ON_Line right;
  ON_Line left;
  ON_3dPoint local_40;
  
  this_00 = &this->m_t;
  bVar1 = ON_Interval::Includes(this_00,t,true);
  if (!bVar1) {
    return false;
  }
  iVar2 = this->m_dim;
  t0 = ON_Interval::operator[](this_00,0);
  t1 = ON_Interval::operator[](this_00,1);
  ON_Line::ON_Line(&left);
  ON_Line::ON_Line(&right);
  left.from.z = (this->m_line).from.z;
  left.from.x = (this->m_line).from.x;
  left.from.y = (this->m_line).from.y;
  t_00 = ON_Interval::NormalizedParameterAt(this_00,t);
  ON_Line::PointAt(&local_40,&this->m_line,t_00);
  left.to.z = local_40.z;
  left.to.x = local_40.x;
  left.to.y = local_40.y;
  right.from.x = local_40.x;
  right.from.y = local_40.y;
  right.from.z = local_40.z;
  right.to.x = (this->m_line).to.x;
  right.to.y = (this->m_line).to.y;
  right.to.z = (this->m_line).to.z;
  bVar1 = ON_3dPoint::IsCoincident(&left.from,&left.to);
  if ((bVar1) || (bVar1 = ON_3dPoint::IsCoincident(&right.from,&right.to), bVar1)) {
    bVar1 = false;
  }
  else {
    this_01 = Cast((ON_Object *)*left_side);
    this_02 = Cast((ON_Object *)*right_side);
    if ((this_01 == (ON_LineCurve *)0x0) && (*left_side != (ON_Curve *)0x0)) {
      sFormat = "ON_LineCurve::Split - input left_side not an ON_LineCurve*";
      iVar2 = 0x278;
    }
    else {
      if ((this_02 != (ON_LineCurve *)0x0) || (*right_side == (ON_Curve *)0x0)) {
        if (this_01 == (ON_LineCurve *)0x0) {
          this_01 = (ON_LineCurve *)operator_new(0x58);
          ON_LineCurve(this_01);
          *left_side = (ON_Curve *)this_01;
        }
        if (this_02 == (ON_LineCurve *)0x0) {
          this_02 = (ON_LineCurve *)operator_new(0x58);
          ON_LineCurve(this_02);
          *right_side = (ON_Curve *)this_02;
        }
        ON_Curve::DestroyCurveTree(&this_01->super_ON_Curve);
        (this_01->m_line).to.y = left.to.y;
        (this_01->m_line).to.z = left.to.z;
        (this_01->m_line).from.z = left.from.z;
        (this_01->m_line).to.x = left.to.x;
        (this_01->m_line).from.x = left.from.x;
        (this_01->m_line).from.y = left.from.y;
        ON_Interval::Set(&this_01->m_t,t0,t);
        this_01->m_dim = iVar2;
        ON_Curve::DestroyCurveTree(&this_02->super_ON_Curve);
        (this_02->m_line).to.y = right.to.y;
        (this_02->m_line).to.z = right.to.z;
        (this_02->m_line).from.z = right.from.z;
        (this_02->m_line).to.x = right.to.x;
        (this_02->m_line).from.x = right.from.x;
        (this_02->m_line).from.y = right.from.y;
        ON_Interval::Set(&this_02->m_t,t,t1);
        this_02->m_dim = iVar2;
        bVar1 = true;
        goto LAB_004e5ab0;
      }
      sFormat = "ON_LineCurve::Split - input right_side not an ON_LineCurve*";
      iVar2 = 0x27d;
    }
    bVar1 = false;
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_linecurve.cpp"
               ,iVar2,"",sFormat);
  }
LAB_004e5ab0:
  ON_Line::~ON_Line(&right);
  ON_Line::~ON_Line(&left);
  return bVar1;
}

Assistant:

bool ON_LineCurve::Split( 
      double t,
      ON_Curve*& left_side,
      ON_Curve*& right_side
    ) const

{
  bool rc = false;
  if ( m_t.Includes(t,true) )
  {
    const int dim = m_dim;
    double t0 = m_t[0];
    double t1 = m_t[1];
    ON_Line left, right;
    left.from = m_line.from;
    left.to = m_line.PointAt(m_t.NormalizedParameterAt(t));
    right.from = left.to;
    right.to = m_line.to;

		// 27 March 2003, Greg Arden.  Result must pass IsValid()
    // Fixes RH-64018
    // 6 May 21, GBA, changed ON_LineCurve::IsValid and so this was updated
		if( left.from.IsCoincident(left.to) || right.from.IsCoincident(right.to) )
			return false;

    ON_LineCurve* left_line = ON_LineCurve::Cast(left_side);
    ON_LineCurve* right_line = ON_LineCurve::Cast(right_side);
    if ( left_side && !left_line )
    {
      ON_ERROR("ON_LineCurve::Split - input left_side not an ON_LineCurve*");
      return false;
    }
    if ( right_side && !right_line )
    {
      ON_ERROR("ON_LineCurve::Split - input right_side not an ON_LineCurve*");
      return false;
    }
    if ( !left_line )
    {
      left_line = new ON_LineCurve();
      left_side = left_line;
    }
    if ( !right_line )
    {
      right_line = new ON_LineCurve();
      right_side = right_line;
    }

    left_line->DestroyCurveTree();
    left_line->m_line = left;
    left_line->m_t.Set( t0, t );
    left_line->m_dim = dim;

    right_line->DestroyCurveTree();
    right_line->m_line = right;
    right_line->m_t.Set( t, t1 );
    right_line->m_dim = dim;

    rc = true;
  }
  return rc;
}